

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O3

void __thiscall
UEFIToolApplication::UEFIToolApplication(UEFIToolApplication *this,int *argc,char **argv)

{
  UEFITool *this_00;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  QApplication::QApplication(&this->super_QApplication,argc,argv,0x60204);
  *(undefined ***)this = &PTR_metaObject_002b1440;
  QVar1.m_data = (storage_type *)0x8;
  QVar1.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar1);
  local_58 = local_38;
  uStack_50 = uStack_30;
  local_48 = local_28;
  QCoreApplication::setOrganizationName((QString *)&local_58);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  QVar2.m_data = (storage_type *)0xb;
  QVar2.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar2);
  local_58 = local_38;
  uStack_50 = uStack_30;
  local_48 = local_28;
  QCoreApplication::setOrganizationDomain((QString *)&local_58);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  QVar3.m_data = (storage_type *)0x8;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar3);
  local_58 = local_38;
  uStack_50 = uStack_30;
  local_48 = local_28;
  QCoreApplication::setApplicationName((QString *)&local_58);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x8;
  QVar4.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar4);
  local_58 = local_38;
  uStack_50 = uStack_30;
  local_48 = local_28;
  QGuiApplication::setDesktopFileName((QString *)&local_58);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  this_00 = (UEFITool *)operator_new(0x100);
  UEFITool::UEFITool(this_00,(QWidget *)0x0);
  this->tool = this_00;
  return;
}

Assistant:

UEFIToolApplication(int &argc, char **argv)
    : QApplication(argc, argv)
    {
        setOrganizationName("CodeRush");
        setOrganizationDomain("coderush.me");
        setApplicationName("UEFITool");
#if QT_VERSION >= QT_VERSION_CHECK(5, 7, 0)
        setDesktopFileName("uefitool");
#endif
        tool = new UEFITool();
    }